

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O3

int demo1(void)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  byte bVar5;
  ulong uVar6;
  string input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> charvect;
  vector<unsigned_char,_std::allocator<unsigned_char>_> charvectslice;
  CyclicHash<unsigned_int,_unsigned_char> hf;
  allocator_type local_481;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  byte local_470 [16];
  void *local_460;
  void *local_458;
  void *local_448;
  void *local_440;
  CyclicHash<unsigned_int,_unsigned_char> local_430;
  
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash(&local_430,3,0x20);
  local_480._M_current = (char *)local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"ABCD","");
  bVar5 = (char)local_430.wordsize - 1;
  uVar2 = (local_430.hashvalue >> (bVar5 & 0x1f) | (local_430.mask1 & local_430.hashvalue) * 2) ^
          local_430.hasher.hashvalues[(byte)local_480._M_current[1]];
  uVar2 = (uVar2 >> (bVar5 & 0x1f) | (uVar2 & local_430.mask1) * 2) ^
          local_430.hasher.hashvalues[(byte)local_480._M_current[2]];
  local_430.hashvalue =
       (uVar2 >> (bVar5 & 0x1f) | (local_430.mask1 & uVar2) * 2) ^
       local_430.hasher.hashvalues[(byte)local_480._M_current[3]];
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Hash value of BCD is ",0x15);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_448,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_480._M_current + 1),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_480._M_current + 4),(allocator_type *)&local_460);
  if (local_440 == local_448) {
    uVar2 = 0;
  }
  else {
    uVar6 = 0;
    uVar2 = 0;
    do {
      uVar2 = (uVar2 >> ((char)local_430.wordsize - 1U & 0x1f) | (uVar2 & local_430.mask1) * 2) ^
              local_430.hasher.hashvalues[*(byte *)((long)local_448 + uVar6)];
      uVar6 = uVar6 + 1;
    } while ((uVar6 & 0xffffffff) < (ulong)((long)local_440 - (long)local_448));
  }
  if (uVar2 != local_430.hashvalue) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"bug");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = local_430.hasher.hashvalues[(byte)*local_480._M_current];
  uVar2 = (uVar1 >> ((char)local_430.wordsize - (byte)local_430.myr & 0x1f) |
          (local_430.maskn & uVar1) << ((byte)local_430.myr & 0x1f)) ^
          local_430.hasher.hashvalues[(byte)local_480._M_current[3]] ^ uVar2;
  local_430.hashvalue = (uVar2 & 1) << ((char)local_430.wordsize - 1U & 0x1f) | uVar2 >> 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Hash value of ABC is ",0x15);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_460,local_480,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_480._M_current + 3),&local_481);
  if (local_458 == local_460) {
    uVar2 = 0;
  }
  else {
    uVar6 = 0;
    uVar2 = 0;
    do {
      uVar2 = (uVar2 >> ((char)local_430.wordsize - 1U & 0x1f) | (uVar2 & local_430.mask1) * 2) ^
              local_430.hasher.hashvalues[*(byte *)((long)local_460 + uVar6)];
      uVar6 = uVar6 + 1;
    } while ((uVar6 & 0xffffffff) < (ulong)((long)local_458 - (long)local_460));
  }
  if (uVar2 != local_430.hashvalue) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"bug");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_460 != (void *)0x0) {
    operator_delete(local_460);
  }
  if (local_448 != (void *)0x0) {
    operator_delete(local_448);
  }
  if ((byte *)local_480._M_current != local_470) {
    operator_delete(local_480._M_current);
  }
  return 0;
}

Assistant:

int demo1() {
  CyclicHash<> hf(3, 32);
  string input = "ABCD";
  hf.eat(input[1]); // B
  hf.eat(input[2]); // C
  hf.eat(input[3]); // D
  cout << "Hash value of BCD is " << hf.hashvalue << endl;
  // we check the answer going the long way...
  const std::vector<unsigned char> charvectslice(input.begin() + 1,
                                                 input.begin() + 4);
  uint32_t trueanswerslice = hf.hash(charvectslice);
  if (trueanswerslice != hf.hashvalue)
    throw runtime_error("bug");
  // we continue
  hf.reverse_update(input[0], input[3]); // remove D, prepend A
  cout << "Hash value of ABC is " << hf.hashvalue << endl;
  // we check the answer going the long way
  const std::vector<unsigned char> charvect(input.begin(), input.begin() + 3);
  uint32_t trueanswer = hf.hash(charvect);
  if (trueanswer != hf.hashvalue)
    throw runtime_error("bug");
  return 0;
}